

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::writeStandard(QPDFWriter *this)

{
  size_t *psVar1;
  int size;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  string *psVar2;
  size_t max_offset;
  bool bVar3;
  char cVar4;
  uint uVar5;
  element_type *peVar6;
  size_t in_RCX;
  ulong uVar7;
  size_type *psVar8;
  size_t __n;
  long lVar9;
  ulong uVar10;
  uint __len;
  PipelinePopper pp_md5;
  string __str;
  QPDFObjectHandle local_68;
  PipelinePopper local_58;
  long *local_48;
  void *local_40;
  long local_38 [2];
  
  local_58.stack_id = 0;
  local_58.qw = this;
  if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      deterministic_id == true) {
    pushMD5Pipeline(this,&local_58);
  }
  writeHeader(this);
  peVar6 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ::qpdf::pl::Count::write
            (peVar6->pipeline,(int)(peVar6->extra_header_text)._M_dataplus._M_p,
             (void *)(peVar6->extra_header_text)._M_string_length,in_RCX);
  if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pclm
      == true) {
    enqueueObjectsPCLm(this);
  }
  else {
    enqueueObjectsStandard(this);
  }
  peVar6 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar7 = peVar6->object_queue_front;
  lVar9 = (long)(peVar6->object_queue).
                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar7 < (ulong)((long)*(pointer *)
                             ((long)&(peVar6->object_queue).
                                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                     ._M_impl.super__Vector_impl_data + 8) - lVar9 >> 4)) {
    do {
      local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = *(element_type **)(lVar9 + uVar7 * 0x10);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 8 + uVar7 * 0x10);
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        peVar6->object_queue_front = uVar7 + 1;
        local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = this_00;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          cVar4 = __libc_single_threaded;
          UNLOCK();
          psVar1 = &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->object_queue_front;
          *psVar1 = *psVar1 + 1;
          if (cVar4 == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
            goto LAB_001f7178;
          }
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
          peVar6->object_queue_front = peVar6->object_queue_front + 1;
        }
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
LAB_001f7178:
      writeObject(this,&local_68,-1);
      if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      peVar6 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar7 = peVar6->object_queue_front;
      lVar9 = (long)(peVar6->object_queue).
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)*(pointer *)
                                    ((long)&(peVar6->object_queue).
                                            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                            ._M_impl.super__Vector_impl_data + 8) - lVar9 >> 4));
  }
  if (peVar6->encrypted == true) {
    writeEncryptionDictionary(this);
    peVar6 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  psVar2 = peVar6->pipeline->str;
  psVar8 = (size_type *)&peVar6->pipeline->count;
  if (psVar2 != (string *)0x0) {
    psVar8 = &psVar2->_M_string_length;
  }
  max_offset = *psVar8;
  size = peVar6->next_objid;
  if (*(size_t *)
       ((long)&(peVar6->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header + 0x20) == 0) {
    __n = (size_t)(size - 1U);
    writeXRefTable(this,t_normal,0,size - 1U,size,0,false,0,0,0,0);
  }
  else {
    peVar6->next_objid = size + 1;
    __n = max_offset;
    writeXRefStream(this,size,size,max_offset,t_normal,0,size,size + 1,0,0,0,0,false,0);
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27e566,(void *)0xa,__n);
  uVar7 = -max_offset;
  if (0 < (long)max_offset) {
    uVar7 = max_offset;
  }
  __len = 1;
  if (9 < uVar7) {
    __n = uVar7;
    uVar5 = 4;
    do {
      __len = uVar5;
      if (__n < 100) {
        __len = __len - 2;
        goto LAB_001f730b;
      }
      if (__n < 1000) {
        __len = __len - 1;
        goto LAB_001f730b;
      }
      if (__n < 10000) goto LAB_001f730b;
      uVar10 = __n / 10000;
      bVar3 = 99999 < __n;
      __n = uVar10;
      uVar5 = __len + 4;
    } while (bVar3);
    __len = __len + 1;
  }
LAB_001f730b:
  local_48 = local_38;
  std::__cxx11::string::_M_construct
            ((ulong)&local_48,(char)__len - (char)((long)max_offset >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_48 - ((long)max_offset >> 0x3f)),__len,uVar7);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_48,local_40,__n);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27e51d,(void *)0x7,__n);
  PipelinePopper::~PipelinePopper(&local_58);
  return;
}

Assistant:

void
QPDFWriter::writeStandard()
{
    auto pp_md5 = PipelinePopper(this);
    if (m->deterministic_id) {
        pushMD5Pipeline(pp_md5);
    }

    // Start writing

    writeHeader();
    writeString(m->extra_header_text);

    if (m->pclm) {
        enqueueObjectsPCLm();
    } else {
        enqueueObjectsStandard();
    }

    // Now start walking queue, outputting each object.
    while (m->object_queue_front < m->object_queue.size()) {
        QPDFObjectHandle cur_object = m->object_queue.at(m->object_queue_front);
        ++m->object_queue_front;
        writeObject(cur_object);
    }

    // Write out the encryption dictionary, if any
    if (m->encrypted) {
        writeEncryptionDictionary();
    }

    // Now write out xref.  next_objid is now the number of objects.
    qpdf_offset_t xref_offset = m->pipeline->getCount();
    if (m->object_stream_to_objects.empty()) {
        // Write regular cross-reference table
        writeXRefTable(t_normal, 0, m->next_objid - 1, m->next_objid);
    } else {
        // Write cross-reference stream.
        int xref_id = m->next_objid++;
        writeXRefStream(
            xref_id, xref_id, xref_offset, t_normal, 0, m->next_objid - 1, m->next_objid);
    }
    writeString("startxref\n");
    writeString(std::to_string(xref_offset));
    writeString("\n%%EOF\n");

    if (m->deterministic_id) {
        QTC::TC(
            "qpdf",
            "QPDFWriter standard deterministic ID",
            m->object_stream_to_objects.empty() ? 0 : 1);
    }
}